

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall nodecpp::log::LogTransport::insertSingleMsg(LogTransport *this,char *msg,size_t sz)

{
  ulong uVar1;
  size_t endoff;
  LogTransport *local_28;
  ulong local_20;
  size_t sz_local;
  char *msg_local;
  LogTransport *this_local;
  
  endoff = (size_t)&local_20;
  local_28 = this;
  local_20 = sz;
  sz_local = (size_t)msg;
  msg_local = (char *)this;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,nodecpp::log::LogTransport::insertSingleMsg(char_const*,unsigned_long)::__0>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
             ,0x111,(anon_class_16_2_51563df0 *)&endoff,"sz <= logData->availableSize()");
  uVar1 = this->logData->end & this->logData->buffSize - 1;
  if (this->logData->buffSize - uVar1 < local_20) {
    memcpy(this->logData->buff + uVar1,(void *)sz_local,this->logData->buffSize - uVar1);
    memcpy(this->logData->buff,(void *)((sz_local + this->logData->buffSize) - uVar1),
           local_20 - (this->logData->buffSize - uVar1));
  }
  else {
    memcpy(this->logData->buff + uVar1,(void *)sz_local,local_20);
  }
  this->logData->end = local_20 + this->logData->end;
  return;
}

Assistant:

void LogTransport::insertSingleMsg( const char* msg, size_t sz ) // under lock
	{
		NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, sz <= logData->availableSize() );
		size_t endoff = logData->end & (logData->buffSize - 1);
		if ( logData->buffSize - endoff >= sz )
		{
			memcpy( logData->buff + endoff, msg, sz );
		}
		else
		{
			memcpy( logData->buff + endoff, msg, logData->buffSize - endoff );
			memcpy( logData->buff, msg + logData->buffSize - endoff, sz - (logData->buffSize - endoff) );
		}
		logData->end += sz;
	}